

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# padding.cpp
# Opt level: O1

int __thiscall ncnn::Padding::load_model(Padding *this,ModelBin *mb)

{
  int *piVar1;
  void *__ptr;
  Allocator *pAVar2;
  void *local_68;
  int *piStack_60;
  size_t local_58;
  int local_50;
  Allocator *local_48;
  int local_40;
  int iStack_3c;
  int iStack_38;
  int iStack_34;
  int local_30;
  size_t local_28;
  
  if (this->per_channel_pad_data_size != 0) {
    (*mb->_vptr_ModelBin[2])(&local_68,mb,(ulong)(uint)this->per_channel_pad_data_size,1);
    if (&this->per_channel_pad_data != (Mat *)&local_68) {
      if (piStack_60 != (int *)0x0) {
        LOCK();
        *piStack_60 = *piStack_60 + 1;
        UNLOCK();
      }
      piVar1 = (this->per_channel_pad_data).refcount;
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 == 0) {
          __ptr = (this->per_channel_pad_data).data;
          pAVar2 = (this->per_channel_pad_data).allocator;
          if (pAVar2 == (Allocator *)0x0) {
            if (__ptr != (void *)0x0) {
              free(__ptr);
            }
          }
          else {
            (*pAVar2->_vptr_Allocator[3])();
          }
        }
      }
      (this->per_channel_pad_data).cstep = 0;
      *(undefined8 *)((long)&(this->per_channel_pad_data).refcount + 4) = 0;
      *(undefined8 *)((long)&(this->per_channel_pad_data).elemsize + 4) = 0;
      (this->per_channel_pad_data).data = (void *)0x0;
      (this->per_channel_pad_data).refcount = (int *)0x0;
      (this->per_channel_pad_data).dims = 0;
      (this->per_channel_pad_data).w = 0;
      (this->per_channel_pad_data).h = 0;
      (this->per_channel_pad_data).d = 0;
      (this->per_channel_pad_data).c = 0;
      (this->per_channel_pad_data).data = local_68;
      (this->per_channel_pad_data).refcount = piStack_60;
      (this->per_channel_pad_data).elemsize = local_58;
      (this->per_channel_pad_data).elempack = local_50;
      (this->per_channel_pad_data).allocator = local_48;
      (this->per_channel_pad_data).dims = local_40;
      (this->per_channel_pad_data).w = iStack_3c;
      (this->per_channel_pad_data).h = iStack_38;
      (this->per_channel_pad_data).d = iStack_34;
      (this->per_channel_pad_data).c = local_30;
      (this->per_channel_pad_data).cstep = local_28;
    }
    if (piStack_60 != (int *)0x0) {
      LOCK();
      *piStack_60 = *piStack_60 + -1;
      UNLOCK();
      if (*piStack_60 == 0) {
        if (local_48 == (Allocator *)0x0) {
          if (local_68 != (void *)0x0) {
            free(local_68);
          }
        }
        else {
          (*local_48->_vptr_Allocator[3])();
        }
      }
    }
  }
  return 0;
}

Assistant:

int Padding::load_model(const ModelBin& mb)
{
    if (per_channel_pad_data_size)
    {
        per_channel_pad_data = mb.load(per_channel_pad_data_size, 1);
    }

    return 0;
}